

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O3

bool Assimp::FBX::anon_unknown_3::ReadScope
               (TokenList *output_tokens,char *input,char **cursor,char *end,bool is64bits)

{
  byte *pbVar1;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *this;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  char *pcVar9;
  uint uVar10;
  bool is64bits_00;
  byte *end_00;
  iterator iVar11;
  int iVar12;
  undefined7 in_register_00000081;
  byte *pbVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  char *sb;
  char *se;
  string local_c8;
  uint64_t local_a8;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *local_a0;
  ulong local_98;
  uint64_t local_90;
  ulong local_88;
  int local_80;
  uint32_t local_7c;
  char *local_78;
  byte *local_70;
  undefined8 local_68;
  byte *local_60;
  undefined8 local_58;
  byte local_50 [16];
  char *local_40;
  char *local_38;
  
  iVar12 = (int)CONCAT71(in_register_00000081,is64bits);
  local_a0 = (vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
             output_tokens;
  if (iVar12 == 0) {
    uVar3 = ReadWord(input,cursor,end);
    local_98 = (ulong)uVar3;
  }
  else {
    local_98 = ReadDoubleWord(input,cursor,end);
  }
  if (local_98 != 0) {
    if ((ulong)((long)end - (long)input) < local_98) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"block offset is out of range","");
      TokenizeError(&local_c8,(long)*cursor - (long)input);
    }
    if (local_98 < (ulong)((long)*cursor - (long)input)) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"block offset is negative out of range","");
      TokenizeError(&local_c8,(long)*cursor - (long)input);
    }
    local_80 = iVar12;
    if (is64bits) {
      local_a8 = ReadDoubleWord(input,cursor,end);
      local_90 = ReadDoubleWord(input,cursor,end);
    }
    else {
      uVar3 = ReadWord(input,cursor,end);
      local_a8 = (uint64_t)uVar3;
      uVar3 = ReadWord(input,cursor,end);
      local_90 = (uint64_t)uVar3;
    }
    ReadString(&local_38,&local_40,input,cursor,end,false,false);
    local_c8._M_dataplus._M_p = (pointer)operator_new(0x28);
    pcVar17 = *cursor;
    ((Token *)local_c8._M_dataplus._M_p)->sbegin = local_38;
    ((Token *)local_c8._M_dataplus._M_p)->send = local_40;
    ((Token *)local_c8._M_dataplus._M_p)->type = TokenType_KEY;
    (((Token *)local_c8._M_dataplus._M_p)->field_3).line = (long)pcVar17 - (long)input;
    ((Token *)local_c8._M_dataplus._M_p)->column = 0xffffffff;
    iVar11._M_current = *(Token ***)(local_a0 + 8);
    if (iVar11._M_current == *(Token ***)(local_a0 + 0x10)) {
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      _M_realloc_insert<Assimp::FBX::Token_const*>(local_a0,iVar11,(Token **)&local_c8);
    }
    else {
      *iVar11._M_current = (Token *)local_c8._M_dataplus._M_p;
      *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 8;
    }
    pcVar17 = *cursor;
    pcVar9 = pcVar17;
    if (local_a8 != 0) {
      end_00 = (byte *)(pcVar17 + local_90);
      local_88 = local_a8 - 1;
      uVar10 = 1;
      uVar15 = 0;
      local_78 = pcVar17;
      local_70 = end_00;
      do {
        pbVar1 = (byte *)*cursor;
        if (pbVar1 == end_00) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"cannot ReadData, out of bounds reading length","");
          TokenizeError(&local_c8,(long)*cursor - (long)input);
        }
        local_50[0] = *pbVar1;
        *cursor = (char *)(pbVar1 + 1);
        switch((uint)local_50[0]) {
        case 0x43:
          pbVar13 = pbVar1 + 2;
          break;
        case 0x44:
        case 0x4c:
          pbVar13 = pbVar1 + 9;
          break;
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x4a:
        case 0x4b:
        case 0x4d:
        case 0x4e:
        case 0x4f:
        case 0x50:
        case 0x51:
switchD_00193ddf_caseD_45:
          local_60 = local_50;
          local_58 = 1;
          local_50[1] = 0;
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1f99eb);
          local_c8._M_dataplus._M_p = (pointer)*plVar6;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_c8._M_dataplus._M_p == psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = plVar6[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
          }
          local_c8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          TokenizeError(&local_c8,(long)*cursor - (long)input);
        case 0x46:
        case 0x49:
          pbVar13 = pbVar1 + 5;
          break;
        case 0x52:
          uVar3 = ReadWord(input,cursor,(char *)end_00);
          pbVar13 = (byte *)(*cursor + uVar3);
          break;
        case 0x53:
          ReadString((char **)&local_c8,(char **)&local_60,input,cursor,(char *)end_00,true,true);
          pbVar13 = (byte *)*cursor;
          goto LAB_00193f17;
        default:
          uVar2 = local_50[0] - 0x59;
          if (0x13 < uVar2) goto switchD_00193ddf_caseD_45;
          if ((0x92c00U >> (uVar2 & 0x1f) & 1) != 0) {
            local_68 = CONCAT71((int7)((ulong)iVar11._M_current >> 8),local_50[0]);
            local_7c = ReadWord(input,cursor,(char *)end_00);
            uVar3 = ReadWord(input,cursor,(char *)end_00);
            uVar4 = ReadWord(input,cursor,(char *)end_00);
            if (uVar3 != 1) {
              if (uVar3 != 0) {
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8,"cannot ReadData, unknown encoding","");
                TokenizeError(&local_c8,(long)*cursor - (long)input);
              }
              uVar2 = (int)local_68 - 99;
              iVar12 = 0;
              if ((byte)uVar2 < 10) {
                iVar12 = *(int *)(&DAT_001f9704 + (ulong)(uVar2 & 0xff) * 4);
              }
              if (iVar12 * local_7c != uVar4) {
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8,
                           "cannot ReadData, calculated data stride differs from what the file claims"
                           ,"");
                TokenizeError(&local_c8,(long)*cursor - (long)input);
              }
            }
            pbVar13 = (byte *)(*cursor + uVar4);
            *cursor = (char *)pbVar13;
            end_00 = local_70;
            local_50[0] = (byte)local_68;
            goto LAB_00193f17;
          }
          if (uVar2 == 0) {
            pbVar13 = pbVar1 + 3;
            break;
          }
          if (uVar2 != 9) goto switchD_00193ddf_caseD_45;
          *cursor = (char *)end_00;
          pbVar13 = end_00;
          goto LAB_00193f20;
        }
        *cursor = (char *)pbVar13;
LAB_00193f17:
        if (end_00 < pbVar13) {
          local_60 = local_50;
          local_58 = 1;
          local_50[1] = 0;
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1f9a13);
          local_c8._M_dataplus._M_p = (pointer)*plVar6;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_c8._M_dataplus._M_p == psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = plVar6[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
          }
          local_c8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          TokenizeError(&local_c8,(long)*cursor - (long)input);
        }
LAB_00193f20:
        local_c8._M_dataplus._M_p = (pointer)operator_new(0x28);
        this = local_a0;
        ((Token *)local_c8._M_dataplus._M_p)->sbegin = (char *)pbVar1;
        ((Token *)local_c8._M_dataplus._M_p)->send = (char *)pbVar13;
        ((Token *)local_c8._M_dataplus._M_p)->type = TokenType_DATA;
        (((Token *)local_c8._M_dataplus._M_p)->field_3).line = (long)pbVar13 - (long)input;
        ((Token *)local_c8._M_dataplus._M_p)->column = 0xffffffff;
        iVar11._M_current = *(Token ***)(local_a0 + 8);
        if (iVar11._M_current == *(Token ***)(local_a0 + 0x10)) {
          std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
          _M_realloc_insert<Assimp::FBX::Token_const*>(local_a0,iVar11,(Token **)&local_c8);
        }
        else {
          *iVar11._M_current = (Token *)local_c8._M_dataplus._M_p;
          *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 8;
        }
        if (local_88 != uVar15) {
          local_c8._M_dataplus._M_p = (pointer)operator_new(0x28);
          pcVar17 = *cursor;
          ((Token *)local_c8._M_dataplus._M_p)->sbegin = pcVar17;
          ((Token *)local_c8._M_dataplus._M_p)->send = pcVar17 + 1;
          ((Token *)local_c8._M_dataplus._M_p)->type = TokenType_COMMA;
          (((Token *)local_c8._M_dataplus._M_p)->field_3).line = (long)pcVar17 - (long)input;
          ((Token *)local_c8._M_dataplus._M_p)->column = 0xffffffff;
          iVar11._M_current = *(Token ***)(this + 8);
          if (iVar11._M_current == *(Token ***)(this + 0x10)) {
            std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
            _M_realloc_insert<Assimp::FBX::Token_const*>(this,iVar11,(Token **)&local_c8);
          }
          else {
            *iVar11._M_current = (Token *)local_c8._M_dataplus._M_p;
            *(long *)(this + 8) = *(long *)(this + 8) + 8;
          }
        }
        uVar15 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar15 < local_a8);
      pcVar17 = *cursor;
      pcVar9 = local_78;
    }
    uVar15 = local_98;
    if ((long)pcVar17 - (long)pcVar9 != local_90) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"property length not reached, something is wrong","");
      TokenizeError(&local_c8,(long)*cursor - (long)input);
    }
    is64bits_00 = SUB41(local_80,0);
    uVar7 = 0xfffffffffffffff3;
    if (is64bits_00 != false) {
      uVar7 = 0xffffffffffffffe7;
    }
    uVar18 = 0xd;
    if (is64bits_00 != false) {
      uVar18 = 0x19;
    }
    uVar16 = (long)pcVar17 - (long)input;
    if (uVar16 < local_98) {
      if (local_98 - uVar16 < uVar18) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"insufficient padding bytes at block end","");
        TokenizeError(&local_c8,(long)*cursor - (long)input);
      }
      local_88 = uVar7;
      local_c8._M_dataplus._M_p = (pointer)operator_new(0x28);
      ((Token *)local_c8._M_dataplus._M_p)->sbegin = pcVar17;
      ((Token *)local_c8._M_dataplus._M_p)->send = pcVar17 + 1;
      ((Token *)local_c8._M_dataplus._M_p)->type = TokenType_OPEN_BRACKET;
      (((Token *)local_c8._M_dataplus._M_p)->field_3).line = uVar16;
      ((Token *)local_c8._M_dataplus._M_p)->column = 0xffffffff;
      iVar11._M_current = *(Token ***)(local_a0 + 8);
      if (iVar11._M_current == *(Token ***)(local_a0 + 0x10)) {
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        _M_realloc_insert<Assimp::FBX::Token_const*>(local_a0,iVar11,(Token **)&local_c8);
      }
      else {
        *iVar11._M_current = (Token *)local_c8._M_dataplus._M_p;
        *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 8;
      }
      pcVar17 = *cursor;
      sVar14 = (long)pcVar17 - (long)input;
      local_a8 = uVar18;
      if (sVar14 < uVar15 - uVar18) {
        lVar5 = local_88 + local_98;
        do {
          ReadScope((TokenList *)local_a0,input,cursor,input + lVar5,is64bits_00);
          pcVar17 = *cursor;
          sVar14 = (long)pcVar17 - (long)input;
        } while (sVar14 < uVar15 - uVar18);
      }
      local_c8._M_dataplus._M_p = (pointer)operator_new(0x28);
      ((Token *)local_c8._M_dataplus._M_p)->sbegin = pcVar17;
      ((Token *)local_c8._M_dataplus._M_p)->send = pcVar17 + 1;
      ((Token *)local_c8._M_dataplus._M_p)->type = TokenType_CLOSE_BRACKET;
      (((Token *)local_c8._M_dataplus._M_p)->field_3).line = sVar14;
      ((Token *)local_c8._M_dataplus._M_p)->column = 0xffffffff;
      iVar11._M_current = *(Token ***)(local_a0 + 8);
      if (iVar11._M_current == *(Token ***)(local_a0 + 0x10)) {
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        _M_realloc_insert<Assimp::FBX::Token_const*>(local_a0,iVar11,(Token **)&local_c8);
      }
      else {
        *iVar11._M_current = (Token *)local_c8._M_dataplus._M_p;
        *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 8;
      }
      lVar5 = 0;
      do {
        if ((*cursor)[lVar5] != '\0') {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "failed to read nested block sentinel, expected all bytes to be 0","");
          TokenizeError(&local_c8,(long)*cursor - (long)input);
        }
        lVar5 = lVar5 + 1;
      } while ((uint)lVar5 < (uint)local_a8);
      pcVar17 = *cursor + local_a8;
      *cursor = pcVar17;
      uVar16 = (long)pcVar17 - (long)input;
    }
    if (uVar16 != local_98) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"scope length not reached, something is wrong","");
      TokenizeError(&local_c8,(long)*cursor - (long)input);
    }
  }
  return local_98 != 0;
}

Assistant:

bool ReadScope(TokenList& output_tokens, const char* input, const char*& cursor, const char* end, bool const is64bits)
{
    // the first word contains the offset at which this block ends
	const uint64_t end_offset = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // we may get 0 if reading reached the end of the file -
    // fbx files have a mysterious extra footer which I don't know
    // how to extract any information from, but at least it always
    // starts with a 0.
    if(!end_offset) {
        return false;
    }

    if(end_offset > Offset(input, end)) {
        TokenizeError("block offset is out of range",input, cursor);
    }
    else if(end_offset < Offset(input, cursor)) {
        TokenizeError("block offset is negative out of range",input, cursor);
    }

    // the second data word contains the number of properties in the scope
	const uint64_t prop_count = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // the third data word contains the length of the property list
	const uint64_t prop_length = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // now comes the name of the scope/key
    const char* sbeg, *send;
    ReadString(sbeg, send, input, cursor, end);

    output_tokens.push_back(new_Token(sbeg, send, TokenType_KEY, Offset(input, cursor) ));

    // now come the individual properties
    const char* begin_cursor = cursor;
    for (unsigned int i = 0; i < prop_count; ++i) {
        ReadData(sbeg, send, input, cursor, begin_cursor + prop_length);

        output_tokens.push_back(new_Token(sbeg, send, TokenType_DATA, Offset(input, cursor) ));

        if(i != prop_count-1) {
            output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_COMMA, Offset(input, cursor) ));
        }
    }

    if (Offset(begin_cursor, cursor) != prop_length) {
        TokenizeError("property length not reached, something is wrong",input, cursor);
    }

    // at the end of each nested block, there is a NUL record to indicate
    // that the sub-scope exists (i.e. to distinguish between P: and P : {})
    // this NUL record is 13 bytes long on 32 bit version and 25 bytes long on 64 bit.
	const size_t sentinel_block_length = is64bits ? (sizeof(uint64_t)* 3 + 1) : (sizeof(uint32_t)* 3 + 1);

    if (Offset(input, cursor) < end_offset) {
        if (end_offset - Offset(input, cursor) < sentinel_block_length) {
            TokenizeError("insufficient padding bytes at block end",input, cursor);
        }

        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_OPEN_BRACKET, Offset(input, cursor) ));

        // XXX this is vulnerable to stack overflowing ..
        while(Offset(input, cursor) < end_offset - sentinel_block_length) {
			ReadScope(output_tokens, input, cursor, input + end_offset - sentinel_block_length, is64bits);
        }
        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_CLOSE_BRACKET, Offset(input, cursor) ));

        for (unsigned int i = 0; i < sentinel_block_length; ++i) {
            if(cursor[i] != '\0') {
                TokenizeError("failed to read nested block sentinel, expected all bytes to be 0",input, cursor);
            }
        }
        cursor += sentinel_block_length;
    }

    if (Offset(input, cursor) != end_offset) {
        TokenizeError("scope length not reached, something is wrong",input, cursor);
    }

    return true;
}